

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O2

void mk_disj(dtree_node_t *node,uint32 clust,comp_quest_t *q,quest_t *conj,uint32 c_idx,
            uint32 *d_idx)

{
  undefined8 *puVar1;
  dtree_node_t *node_00;
  undefined8 *puVar2;
  undefined8 uVar3;
  uint32 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  quest_t *pqVar7;
  long lVar8;
  uint uVar9;
  ulong n_elem;
  
  n_elem = (ulong)c_idx;
  while( true ) {
    node_00 = node->y;
    if ((node_00 == (dtree_node_t *)0x0) && (node->n == (dtree_node_str *)0x0)) break;
    puVar2 = (undefined8 *)node->q;
    uVar3 = *puVar2;
    conj[n_elem].ctxt = (int)uVar3;
    conj[n_elem].neg = (int)((ulong)uVar3 >> 0x20);
    conj[n_elem].pset = *(uint32 *)(puVar2 + 1);
    puVar4 = (uint32 *)puVar2[3];
    conj[n_elem].member = (uint32 *)puVar2[2];
    (&conj[n_elem].member)[1] = puVar4;
    uVar9 = (uint32)n_elem + 1;
    mk_disj(node_00,clust,q,conj,uVar9,d_idx);
    conj[n_elem].neg = (uint)(conj[n_elem].neg == 0);
    node = node->n;
    n_elem = (ulong)uVar9;
  }
  if (node->clust == clust) {
    uVar9 = *d_idx;
    q->prod_len[uVar9] = (uint32)n_elem;
    pqVar7 = (quest_t *)
             __ckd_calloc__(n_elem,0x20,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                            ,0x196);
    q->conj_q[uVar9] = pqVar7;
    for (lVar8 = 0; n_elem << 5 != lVar8; lVar8 = lVar8 + 0x20) {
      pqVar7 = q->conj_q[uVar9];
      puVar2 = (undefined8 *)((long)&conj->ctxt + lVar8);
      uVar3 = *puVar2;
      uVar5 = puVar2[1];
      puVar2 = (undefined8 *)((long)&conj->member + lVar8);
      uVar6 = puVar2[1];
      puVar1 = (undefined8 *)((long)&pqVar7->member + lVar8);
      *puVar1 = *puVar2;
      puVar1[1] = uVar6;
      puVar2 = (undefined8 *)((long)&pqVar7->ctxt + lVar8);
      *puVar2 = uVar3;
      puVar2[1] = uVar5;
    }
    *d_idx = *d_idx + 1;
  }
  return;
}

Assistant:

void
mk_disj(dtree_node_t *node,
	uint32 clust,
	comp_quest_t *q,
	quest_t *conj,
	uint32 c_idx,
	uint32 *d_idx)
{
    if (IS_LEAF(node)) {
	if (node->clust == clust) {
	    uint32 i;
	    uint32 d;

	    d = *d_idx;
	    q->prod_len[d] = c_idx;
	    q->conj_q[d] = (quest_t *)ckd_calloc(c_idx, sizeof(quest_t));
	    for (i = 0; i < c_idx; i++) {
		memcpy(&q->conj_q[d][i], &conj[i], sizeof(quest_t));
	    }

	    ++(*d_idx);
	}
	else
	    return;
    }
    else {
	quest_t *qu;

	qu = (quest_t *)node->q;

	conj[c_idx].ctxt = qu->ctxt;
	conj[c_idx].neg  = qu->neg;
	conj[c_idx].pset = qu->pset;
	conj[c_idx].member = qu->member;
	conj[c_idx].posn = qu->posn;

	mk_disj(node->y, clust, q, conj, c_idx+1, d_idx);

	conj[c_idx].neg = !conj[c_idx].neg;
	mk_disj(node->n, clust, q, conj, c_idx+1, d_idx);

	return;
    }
}